

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O2

void cDump(Clifford *Q)

{
  uint uVar1;
  pointer pBVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  
  pBVar2 = (Q->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  while( true ) {
    if (pBVar2 == (Q->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
      putchar(10);
      return;
    }
    fVar5 = pBVar2->mVal;
    if (0.0 < fVar5) {
      putchar(0x2b);
      fVar5 = pBVar2->mVal;
    }
    printf("%f",(double)fVar5);
    if (pBVar2->mBase != 0) break;
LAB_00106f49:
    pBVar2 = pBVar2 + 1;
  }
  putchar(0x65);
  uVar4 = 0;
  do {
    uVar3 = uVar4;
    do {
      if (tq + tp <= (int)uVar3) goto LAB_00106f49;
      uVar4 = uVar3 + 1;
      uVar1 = uVar3 & 0x1f;
      uVar3 = uVar4;
    } while (((uint)pBVar2->mBase >> uVar1 & 1) == 0);
    printf("%d",(ulong)uVar4);
  } while( true );
}

Assistant:

void cDump(Clifford Q)
{
 idx i=Q.begin();
 while(i!=Q.end())
	    {
		//SIGNO DEL BLADE	
		if ((*i).mVal > 0)printf("+");

		//VALOR DEL BLADE	
		printf("%f",(i->mVal));
		//NOMBRE DEL BLADE
        if(i->mBase){printf("e");;
		for(register int j=0;j<(tp+tq);j++)
		{
			if(((i->mBase)>>j)&1)
			{
				printf("%d",(j+1));
			}
		}
		}
	    i++;
	    }
		
   printf("\n");
 return ;
}